

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t output_code(archive_write_filter *f,wchar_t ocode)

{
  void *pvVar1;
  wchar_t wVar2;
  byte bVar3;
  int iVar4;
  wchar_t bit_offset;
  wchar_t clear_flg;
  wchar_t ret;
  wchar_t bits;
  private_data_conflict4 *state;
  wchar_t ocode_local;
  archive_write_filter *f_local;
  
  pvVar1 = f->data;
  iVar4 = *(int *)((long)pvVar1 + 0x6516c) % 8;
  bVar3 = (byte)iVar4;
  *(byte *)((long)pvVar1 + 0x65170) =
       *(byte *)((long)pvVar1 + 0x65170) | (byte)(ocode << (bVar3 & 0x1f));
  output_byte(f,*(uchar *)((long)pvVar1 + 0x65170));
  clear_flg = *(int *)((long)pvVar1 + 0x18) - (8 - iVar4);
  state._4_4_ = ocode >> (8 - bVar3 & 0x1f);
  if (L'\a' < clear_flg) {
    output_byte(f,(uchar)state._4_4_);
    state._4_4_ = state._4_4_ >> 8;
    clear_flg = clear_flg + L'\xfffffff8';
  }
  *(int *)((long)pvVar1 + 0x6516c) =
       *(int *)((long)pvVar1 + 0x18) + *(int *)((long)pvVar1 + 0x6516c);
  *(byte *)((long)pvVar1 + 0x65170) = (byte)state._4_4_ & ""[clear_flg];
  if (*(int *)((long)pvVar1 + 0x6516c) == *(int *)((long)pvVar1 + 0x18) << 3) {
    *(undefined4 *)((long)pvVar1 + 0x6516c) = 0;
  }
  if ((ocode == L'Ā') || (*(int *)((long)pvVar1 + 0x1c) < *(int *)((long)pvVar1 + 0x6515c))) {
    if (0 < *(int *)((long)pvVar1 + 0x6516c)) {
      while (*(int *)((long)pvVar1 + 0x6516c) < *(int *)((long)pvVar1 + 0x18) * 8) {
        wVar2 = output_byte(f,*(uchar *)((long)pvVar1 + 0x65170));
        if (wVar2 != L'\0') {
          return wVar2;
        }
        *(int *)((long)pvVar1 + 0x6516c) = *(int *)((long)pvVar1 + 0x6516c) + 8;
        *(undefined1 *)((long)pvVar1 + 0x65170) = 0;
      }
    }
    *(undefined1 *)((long)pvVar1 + 0x65170) = 0;
    *(undefined4 *)((long)pvVar1 + 0x6516c) = 0;
    if (ocode == L'Ā') {
      *(undefined4 *)((long)pvVar1 + 0x18) = 9;
      *(int *)((long)pvVar1 + 0x1c) =
           (1 << ((byte)*(undefined4 *)((long)pvVar1 + 0x18) & 0x1f)) + -1;
    }
    else {
      *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + 1;
      if (*(int *)((long)pvVar1 + 0x18) == 0x10) {
        *(undefined4 *)((long)pvVar1 + 0x1c) = *(undefined4 *)((long)pvVar1 + 0x20);
      }
      else {
        *(int *)((long)pvVar1 + 0x1c) =
             (1 << ((byte)*(undefined4 *)((long)pvVar1 + 0x18) & 0x1f)) + -1;
      }
    }
  }
  return L'\0';
}

Assistant:

static int
output_code(struct archive_write_filter *f, int ocode)
{
	struct private_data *state = f->data;
	int bits, ret, clear_flg, bit_offset;

	clear_flg = ocode == CLEAR;

	/*
	 * Since ocode is always >= 8 bits, only need to mask the first
	 * hunk on the left.
	 */
	bit_offset = state->bit_offset % 8;
	state->bit_buf |= (ocode << bit_offset) & 0xff;
	output_byte(f, state->bit_buf);

	bits = state->code_len - (8 - bit_offset);
	ocode >>= 8 - bit_offset;
	/* Get any 8 bit parts in the middle (<=1 for up to 16 bits). */
	if (bits >= 8) {
		output_byte(f, ocode & 0xff);
		ocode >>= 8;
		bits -= 8;
	}
	/* Last bits. */
	state->bit_offset += state->code_len;
	state->bit_buf = ocode & rmask[bits];
	if (state->bit_offset == state->code_len * 8)
		state->bit_offset = 0;

	/*
	 * If the next entry is going to be too big for the ocode size,
	 * then increase it, if possible.
	 */
	if (clear_flg || state->first_free > state->cur_maxcode) {
	       /*
		* Write the whole buffer, because the input side won't
		* discover the size increase until after it has read it.
		*/
		if (state->bit_offset > 0) {
			while (state->bit_offset < state->code_len * 8) {
				ret = output_byte(f, state->bit_buf);
				if (ret != ARCHIVE_OK)
					return ret;
				state->bit_offset += 8;
				state->bit_buf = 0;
			}
		}
		state->bit_buf = 0;
		state->bit_offset = 0;

		if (clear_flg) {
			state->code_len = 9;
			state->cur_maxcode = MAXCODE(state->code_len);
		} else {
			state->code_len++;
			if (state->code_len == 16)
				state->cur_maxcode = state->max_maxcode;
			else
				state->cur_maxcode = MAXCODE(state->code_len);
		}
	}

	return (ARCHIVE_OK);
}